

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::ParseFormatTrimDecorations(char *fmt,char *buf,int buf_size)

{
  char cVar1;
  int iVar2;
  char *src;
  char *pcVar3;
  char c;
  char *fmt_start;
  int buf_size_local;
  char *buf_local;
  char *fmt_local;
  
  src = ParseFormatTrimDecorationsLeading(fmt);
  buf_local = src;
  fmt_local = fmt;
  if (*src == '%') {
    do {
      pcVar3 = buf_local + 1;
      cVar1 = *buf_local;
      if ((cVar1 == '\0') || ((('@' < cVar1 && (cVar1 < '[')) && (cVar1 != 'L')))) break;
      buf_local = pcVar3;
    } while (((((cVar1 < 'a') || ('z' < cVar1)) || (cVar1 == 'h')) ||
             ((cVar1 == 'j' || (cVar1 == 'l')))) ||
            ((cVar1 == 't' || ((cVar1 == 'w' || (cVar1 == 'z'))))));
    fmt_local = src;
    if (*pcVar3 != '\0') {
      iVar2 = ImMin(((int)pcVar3 + 1) - (int)src,buf_size);
      ImStrncpy(buf,src,(long)iVar2);
      fmt_local = buf;
    }
  }
  return fmt_local;
}

Assistant:

const char* ImGui::ParseFormatTrimDecorations(const char* fmt, char* buf, int buf_size)
{
    // We don't use strchr() because our strings are usually very short and often start with '%'
    const char* fmt_start = ParseFormatTrimDecorationsLeading(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    fmt = fmt_start;
    while (char c = *fmt++)
    {
        if (c >= 'A' && c <= 'Z' && (c != 'L'))  // L is a type modifier, other letters qualify as types aka end of the format
            break;
        if (c >= 'a' && c <= 'z' && (c != 'h' && c != 'j' && c != 'l' && c != 't' && c != 'w' && c != 'z'))  // h/j/l/t/w/z are type modifiers, other letters qualify as types aka end of the format
            break;
    }
    if (fmt[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((int)(fmt + 1 - fmt_start), buf_size));
    return buf;
}